

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O1

void __thiscall QMainWindow::setIconSize(QMainWindow *this,QSize *iconSize)

{
  long lVar1;
  QStyle *pQVar2;
  QSize QVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  void *local_38;
  ulong *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QVar3 = *iconSize;
  if (((ulong)QVar3 & 0x8000000080000000) == 0) {
    uVar4 = (ulong)QVar3 >> 0x20;
  }
  else {
    pQVar2 = QWidget::style(&this->super_QWidget);
    QVar3 = (QSize)(**(code **)(*(long *)pQVar2 + 0xe0))(pQVar2,0x3b,0,this);
    uVar4 = (ulong)QVar3 & 0xffffffff;
  }
  if ((*(int *)(lVar1 + 0x268) != QVar3.wd.m_i.m_i) || (*(int *)(lVar1 + 0x26c) != (int)uVar4)) {
    puStack_30 = (ulong *)(lVar1 + 0x268);
    *puStack_30 = (ulong)QVar3 & 0xffffffff | uVar4 << 0x20;
    local_38 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
  }
  *(bool *)(lVar1 + 0x270) = -1 < ((iconSize->ht).m_i | (iconSize->wd).m_i);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindow::setIconSize(const QSize &iconSize)
{
    Q_D(QMainWindow);
    QSize sz = iconSize;
    if (!sz.isValid()) {
        const int metric = style()->pixelMetric(QStyle::PM_ToolBarIconSize, nullptr, this);
        sz = QSize(metric, metric);
    }
    if (d->iconSize != sz) {
        d->iconSize = sz;
        emit iconSizeChanged(d->iconSize);
    }
    d->explicitIconSize = iconSize.isValid();
}